

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cpp
# Opt level: O0

size_t header_callback(char *buffer,size_t size,size_t nitems,curl_off_t *userdata)

{
  long lVar1;
  char *pcVar2;
  undefined8 uStack_50;
  char *local_48;
  char *local_40;
  char *head_occur_position;
  unsigned_long __vla_expr0;
  long *local_28;
  curl_off_t *userdata_local;
  size_t nitems_local;
  size_t size_local;
  char *buffer_local;
  
  __vla_expr0 = (unsigned_long)&local_48;
  head_occur_position = (char *)(nitems + 1);
  lVar1 = -(nitems + 0x10 & 0xfffffffffffffff0);
  local_48 = (char *)((long)&local_48 + lVar1);
  local_28 = userdata;
  userdata_local = (curl_off_t *)nitems;
  nitems_local = size;
  size_local = (size_t)buffer;
  *(undefined8 *)((long)&uStack_50 + lVar1) = 0x105fdf;
  copy_and_low(buffer,(char *)((long)&local_48 + lVar1),nitems);
  pcVar2 = local_48;
  local_48[(long)userdata_local + -2] = '\0';
  *(undefined8 *)((long)&uStack_50 + lVar1) = 0x105ffb;
  local_40 = strstr(pcVar2,"content-length: ");
  if (local_40 != (char *)0x0) {
    pcVar2 = local_40 + 0x10;
    *(undefined8 *)((long)&uStack_50 + lVar1) = 0x10601d;
    lVar1 = strtol(pcVar2,(char **)0x0,0);
    *local_28 = lVar1;
  }
  return (long)userdata_local * nitems_local;
}

Assistant:

static size_t header_callback(char *buffer, size_t size, size_t nitems, curl_off_t *userdata) {
    char head_data[nitems + 1];
    copy_and_low(buffer, head_data, nitems);
    head_data[nitems - 2] = 0;
    char *head_occur_position = strstr(head_data, "content-length: ");
    if (head_occur_position) {
        *userdata = strtol(head_occur_position + sizeof("content-length: ") - 1, nullptr, 0);
    }
    return nitems * size;
}